

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall FixedVssInstance::enforceBoundaryConstraints(FixedVssInstance *this)

{
  Instance *pIVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Z3_ast p_Var5;
  ulong uVar6;
  ast local_60;
  optimize *local_50;
  ast local_48;
  FixedVssInstance *local_38;
  
  iVar3 = Z3_ast_vector_size(((this->super_Instance).borderVars.super_object.m_ctx)->m_ctx,
                             (this->super_Instance).borderVars.m_vector);
  if (iVar3 != 0) {
    iVar3 = (int)this + 0x170;
    pIVar1 = &this->super_Instance;
    local_50 = &(this->super_Instance).solver;
    uVar6 = 0;
    local_38 = this;
    do {
      bVar2 = Graph::isBoundary(&pIVar1->graph,(int)uVar6);
      if (bVar2) {
        z3::ast_vector_tpl<z3::expr>::operator[]((ast_vector_tpl<z3::expr> *)&local_48,iVar3);
        z3::optimize::add(local_50,(expr *)&local_48);
        z3::ast::~ast(&local_48);
      }
      else {
        z3::ast_vector_tpl<z3::expr>::operator[]((ast_vector_tpl<z3::expr> *)&local_60,iVar3);
        bVar2 = z3::expr::is_bool((expr *)&local_60);
        if (!bVar2) {
          __assert_fail("a.is_bool()","/usr/include/z3++.h",0x609,"expr z3::operator!(const expr &)"
                       );
        }
        p_Var5 = (Z3_ast)Z3_mk_not((local_60.super_object.m_ctx)->m_ctx,local_60.m_ast);
        z3::context::check_error(local_60.super_object.m_ctx);
        local_48.super_object.m_ctx = local_60.super_object.m_ctx;
        local_48.m_ast = p_Var5;
        Z3_inc_ref((local_60.super_object.m_ctx)->m_ctx,p_Var5);
        z3::optimize::add(local_50,(expr *)&local_48);
        z3::ast::~ast(&local_48);
        z3::ast::~ast(&local_60);
        this = local_38;
      }
      uVar6 = uVar6 + 1;
      uVar4 = Z3_ast_vector_size(((this->super_Instance).borderVars.super_object.m_ctx)->m_ctx,
                                 (this->super_Instance).borderVars.m_vector);
    } while (uVar6 < uVar4);
  }
  return;
}

Assistant:

void FixedVssInstance::enforceBoundaryConstraints() {
  for (size_t vertex = 0; vertex < borderVars.size(); vertex++) {

    if (graph.isBoundary(vertex)) {
      solver.add(borderVars[vertex]);
    } else {
      solver.add(!borderVars[vertex]);
    }
  }
}